

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int gen_publickey_from_rsa_evp
              (LIBSSH2_SESSION *session,uchar **method,size_t *method_len,uchar **pubkeydata,
              size_t *pubkeydata_len,EVP_PKEY *pk)

{
  int iVar1;
  size_t local_60;
  size_t key_len;
  uchar *method_buf;
  uchar *key;
  RSA *rsa;
  EVP_PKEY *pk_local;
  size_t *pubkeydata_len_local;
  uchar **pubkeydata_local;
  size_t *method_len_local;
  uchar **method_local;
  LIBSSH2_SESSION *session_local;
  
  key = (uchar *)0x0;
  key_len = 0;
  rsa = (RSA *)pk;
  pk_local = (EVP_PKEY *)pubkeydata_len;
  pubkeydata_len_local = (size_t *)pubkeydata;
  pubkeydata_local = (uchar **)method_len;
  method_len_local = (size_t *)method;
  method_local = (uchar **)session;
  key = (uchar *)EVP_PKEY_get1_RSA((EVP_PKEY *)pk);
  if (((rsa_st *)key != (rsa_st *)0x0) &&
     (key_len = (*(code *)method_local[1])(7,method_local), key_len != 0)) {
    method_buf = gen_publickey_from_rsa((LIBSSH2_SESSION *)method_local,(RSA *)key,&local_60);
    if (method_buf != (uchar *)0x0) {
      RSA_free((RSA *)key);
      *(undefined4 *)key_len = 0x2d687373;
      *(undefined2 *)(key_len + 4) = 0x7372;
      *(undefined1 *)(key_len + 6) = 0x61;
      *method_len_local = key_len;
      *pubkeydata_local = (uchar *)0x7;
      *pubkeydata_len_local = (size_t)method_buf;
      *(size_t *)pk_local = local_60;
      return 0;
    }
    method_buf = (uchar *)0x0;
  }
  if (key != (uchar *)0x0) {
    RSA_free((RSA *)key);
  }
  if (key_len != 0) {
    (*(code *)method_local[3])(key_len,method_local);
  }
  iVar1 = _libssh2_error((LIBSSH2_SESSION *)method_local,-6,
                         "Unable to allocate memory for private key data");
  return iVar1;
}

Assistant:

static int
gen_publickey_from_rsa_evp(LIBSSH2_SESSION *session,
                           unsigned char **method,
                           size_t *method_len,
                           unsigned char **pubkeydata,
                           size_t *pubkeydata_len,
                           EVP_PKEY *pk)
{
    RSA*           rsa = NULL;
    unsigned char *key;
    unsigned char *method_buf = NULL;
    size_t  key_len;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing public key from RSA private key envelope"));

    rsa = EVP_PKEY_get1_RSA(pk);
    if(!rsa) {
        /* Assume memory allocation error... what else could it be ? */
        goto __alloc_error;
    }

    method_buf = LIBSSH2_ALLOC(session, 7);  /* ssh-rsa. */
    if(!method_buf) {
        goto __alloc_error;
    }

    key = gen_publickey_from_rsa(session, rsa, &key_len);
    if(!key) {
        goto __alloc_error;
    }
    RSA_free(rsa);

    memcpy(method_buf, "ssh-rsa", 7);
    *method         = method_buf;
    *method_len     = 7;
    *pubkeydata     = key;
    *pubkeydata_len = key_len;
    return 0;

__alloc_error:
    if(rsa) {
        RSA_free(rsa);
    }
    if(method_buf) {
        LIBSSH2_FREE(session, method_buf);
    }

    return _libssh2_error(session,
                          LIBSSH2_ERROR_ALLOC,
                          "Unable to allocate memory for private key data");
}